

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<osqp::(anonymous_namespace)::TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test>
::CreateTest(TestFactoryImpl<osqp::(anonymous_namespace)::TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test>
             *this)

{
  Test *this_00;
  TestFactoryImpl<osqp::(anonymous_namespace)::TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test>
  *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  osqp::anon_unknown_0::TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test::
  TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test
            ((TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }